

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall
ON_BezierCurve::GetTightBoundingBox
          (ON_BezierCurve *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  undefined7 in_register_00000011;
  
  bVar1 = ON_GetPointListBoundingBox
                    (this->m_dim,this->m_is_rat != 0,this->m_order,this->m_cv_stride,this->m_cv,
                     tight_bbox,(int)CONCAT71(in_register_00000011,bGrowBox),xform);
  return bVar1;
}

Assistant:

bool ON_BezierCurve::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{

  // The result from ON_GetPointListBoundingBox() is good enough
  // for file IO needs in the public source code version.
  return ON_GetPointListBoundingBox(
    m_dim,
    m_is_rat, 
    m_order, 
    m_cv_stride,
    m_cv,
    tight_bbox,
    bGrowBox,
    xform 
    );
}